

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AbstractDOMParser::cleanUp(AbstractDOMParser *this)

{
  GrammarResolver *this_00;
  void *in_RSI;
  AbstractDOMParser *this_local;
  
  if ((this->fDocumentVector != (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0) &&
     (this->fDocumentVector != (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0)) {
    (*(this->fDocumentVector->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).
      _vptr_BaseRefVectorOf[1])();
  }
  if (((this->fDocumentAdoptedByUser & 1U) == 0) && (this->fDocument != (DOMDocumentImpl *)0x0)) {
    (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x2d])();
  }
  if (this->fScanner != (XMLScanner *)0x0) {
    (*(this->fScanner->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[1])();
  }
  this_00 = this->fGrammarResolver;
  if (this_00 != (GrammarResolver *)0x0) {
    GrammarResolver::~GrammarResolver(this_00);
    XMemory::operator_delete((XMemory *)this_00,in_RSI);
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])
            (this->fMemoryManager,this->fImplementationFeatures);
  if ((this->fValidator != (XMLValidator *)0x0) && (this->fValidator != (XMLValidator *)0x0)) {
    (*this->fValidator->_vptr_XMLValidator[1])();
  }
  return;
}

Assistant:

void AbstractDOMParser::cleanUp()
{
    if (fDocumentVector)
        delete fDocumentVector;

    if (!fDocumentAdoptedByUser && fDocument)
        fDocument->release();

    delete fScanner;
    delete fGrammarResolver;
    // grammar pool *always* owns this
    //delete fURIStringPool;
    fMemoryManager->deallocate(fImplementationFeatures);

    if (fValidator)
        delete fValidator;
}